

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::applyBrand
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,Array<capnp::compiler::Compiler::CompiledType> *arguments)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  byte bVar1;
  size_t sVar2;
  Reader subSource;
  undefined1 auVar3 [40];
  bool bVar4;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar5;
  BrandedDecl *pBVar6;
  Mutex *pMVar7;
  BrandScope *pBVar8;
  byte bVar9;
  long lVar10;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  Compiler *local_360;
  undefined1 local_358 [16];
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  local_348;
  BrandScope *local_2e8;
  BrandScope *pBStack_2e0;
  SegmentReader *local_2d8;
  WirePointer *pWStack_2d0;
  WirePointer *local_2c8;
  WirePointer *pWStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Array<capnp::compiler::BrandedDecl> local_2a8;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_288;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_1d8;
  BrandedDecl *local_128;
  anon_union_168_1_a8c68091_for_NullableValue<capnp::compiler::BrandedDecl>_2 local_120;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ArrayDisposer *local_38;
  
  local_288.mutex = (Mutex *)0x0;
  local_288.value.body.tag = 0;
  local_288.value.brand.disposer = (Disposer *)0x0;
  local_288.value.brand.ptr = (BrandScope *)0x0;
  local_288.value.source._reader.segment = (SegmentReader *)0x0;
  local_288.value.source._reader.capTable = (CapTableReader *)0x0;
  local_288.value.source._reader.data = (WirePointer *)0x0;
  local_288.value.source._reader.pointers._0_6_ = 0;
  local_288.value.source._reader.pointers._6_2_ = 0;
  local_288.value.source._reader.dataSize = 0;
  local_288.value.source._reader.pointerCount = 0;
  local_288.value.source._reader.nestingLimit = 0x7fffffff;
  this_00 = &this->compiler->impl;
  local_360 = (Compiler *)((ulong)local_360 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex);
  sVar2 = *(size_t *)(arguments + 8);
  local_120._0_8_ =
       kj::_::HeapArrayDisposer::allocateImpl
                 (0xa8,0,sVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_120._8_8_ = local_120._0_8_ + sVar2 * 0xa8;
  local_120._16_8_ = &kj::_::HeapArrayDisposer::instance;
  local_128 = (BrandedDecl *)local_120._0_8_;
  if (*(long *)(arguments + 8) != 0) {
    lVar10 = *(long *)arguments;
    do {
      BrandedDecl::BrandedDecl((BrandedDecl *)&local_360,(BrandedDecl *)(lVar10 + 0x10));
      *(uint *)local_120._0_8_ = (uint)local_360;
      if ((uint)local_360 == 2) {
        *(undefined8 *)(local_120._0_8_ + 8) = local_358._0_8_;
        *(undefined8 *)(local_120._0_8_ + 0x10) = local_358._8_8_;
      }
      else if ((uint)local_360 == 1) {
        *(undefined8 *)(local_120._0_8_ + 0x28) = local_348._16_8_;
        *(undefined8 *)(local_120._0_8_ + 0x18) = local_348._0_8_;
        *(undefined8 *)(local_120._0_8_ + 0x20) = local_348._8_8_;
        *(undefined8 *)(local_120._0_8_ + 8) = local_358._0_8_;
        *(undefined8 *)(local_120._0_8_ + 0x10) = local_358._8_8_;
        *(byte *)(local_120._0_8_ + 0x30) = local_348.space[0x18];
        if (local_348.space[0x18] == '\x01') {
          *(undefined8 *)(local_120._0_8_ + 0x58) = local_348._64_8_;
          *(undefined8 *)(local_120._0_8_ + 0x60) = local_348._72_8_;
          *(undefined8 *)(local_120._0_8_ + 0x48) = local_348._48_8_;
          *(undefined8 *)(local_120._0_8_ + 0x50) = local_348._56_8_;
          *(undefined8 *)(local_120._0_8_ + 0x38) = local_348._32_8_;
          *(undefined8 *)(local_120._0_8_ + 0x40) = local_348._40_8_;
          local_348._24_8_ = local_348._24_8_ & 0xffffffffffffff00;
        }
      }
      ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)(local_120._0_8_ + 0x68))->disposer =
           (Disposer *)local_348._80_8_;
      *(undefined8 *)(local_120._0_8_ + 0x70) = local_348._88_8_;
      local_348._88_8_ = (BrandScope *)0x0;
      *(WirePointer **)(local_120._0_8_ + 0x98) = local_2c8;
      *(WirePointer **)(local_120._0_8_ + 0xa0) = pWStack_2c0;
      *(SegmentReader **)(local_120._0_8_ + 0x88) = local_2d8;
      *(WirePointer **)(local_120._0_8_ + 0x90) = pWStack_2d0;
      (((Reader *)(local_120._0_8_ + 0x78))->_reader).segment = (SegmentReader *)local_2e8;
      *(BrandScope **)(local_120._0_8_ + 0x80) = pBStack_2e0;
      local_120._0_8_ = local_120._0_8_ + 0xa8;
      lVar10 = lVar10 + 0xb8;
    } while (lVar10 != *(long *)(arguments + 8) * 0xb8 + *(long *)arguments);
  }
  local_2a8.size_ = (local_120._0_8_ - (long)local_128 >> 3) * -0x30c30c30c30c30c3;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uStack_50 = 0x7fffffff;
  auVar3 = ZEXT1640(ZEXT816(0));
  subSource._reader._40_8_ = 0x7fffffff;
  subSource._reader.segment = (SegmentReader *)auVar3._0_8_;
  subSource._reader.capTable = (CapTableReader *)auVar3._8_8_;
  subSource._reader.data = (void *)auVar3._16_8_;
  subSource._reader.pointers = (WirePointer *)auVar3._24_8_;
  subSource._reader.dataSize = auVar3._32_4_;
  subSource._reader.pointerCount = auVar3._36_2_;
  subSource._reader._38_2_ = auVar3._38_2_;
  local_2a8.ptr = local_128;
  local_2a8.disposer = (ArrayDisposer *)local_120._16_8_;
  local_38 = (ArrayDisposer *)local_120._16_8_;
  BrandedDecl::applyParams
            ((Maybe<capnp::compiler::BrandedDecl> *)&local_128,&(this->decl).value,&local_2a8,
             subSource);
  sVar2 = local_2a8.size_;
  pBVar6 = local_2a8.ptr;
  local_360 = (Compiler *)CONCAT71(local_360._1_7_,local_128._0_1_);
  if (local_128._0_1_ == true) {
    local_358._0_4_ = local_120.value.body.tag;
    if (local_120.value.body.tag == 2) {
      local_358._8_8_ = local_120._8_8_;
      local_348._0_8_ = local_120._16_8_;
    }
    else if (local_120.value.body.tag == 1) {
      local_348._24_8_ = local_120._40_8_;
      local_348._8_8_ = local_120._24_8_;
      local_348._16_8_ = local_120._32_8_;
      local_358._8_8_ = local_120._8_8_;
      local_348._0_8_ = local_120._16_8_;
      local_348.space[0x20] = local_120._48_1_;
      if (local_120._48_1_ == '\x01') {
        local_348._72_8_ = local_120._88_8_;
        local_348._80_8_ = local_120._96_8_;
        local_348._56_8_ = local_120._72_8_;
        local_348._64_8_ = local_120._80_8_;
        local_348._40_8_ = local_120._56_8_;
        local_348._48_8_ = local_120._64_8_;
        local_120._48_1_ = '\0';
      }
    }
    local_348._88_8_ = local_120.value.brand.disposer;
    local_2e8 = local_120.value.brand.ptr;
    local_120.value.brand.ptr = (BrandScope *)0x0;
    pBStack_2e0 = (BrandScope *)local_120.value.source._reader.segment;
    local_2d8 = (SegmentReader *)local_120.value.source._reader.capTable;
    pWStack_2d0 = (WirePointer *)local_120.value.source._reader.data;
    local_2c8 = local_120.value.source._reader.pointers;
    pWStack_2c0 = (WirePointer *)local_120._152_8_;
    local_2b8._0_4_ = local_120.value.source._reader.nestingLimit;
    local_2b8._4_2_ = local_120._164_2_;
    local_2b8._6_2_ = local_120._166_2_;
    if (local_120.value.body.tag - 1 < 2) {
      local_120._0_8_ = local_120._0_8_ & 0xffffffff00000000;
    }
  }
  bVar1 = local_128._0_1_;
  if (local_2a8.ptr != (BrandedDecl *)0x0) {
    local_2a8.ptr = (BrandedDecl *)0x0;
    local_2a8.size_ = 0;
    (**(local_2a8.disposer)->_vptr_ArrayDisposer)
              (local_2a8.disposer,pBVar6,0xa8,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    bVar1 = (byte)local_360;
  }
  bVar9 = bVar1;
  if ((bVar1 & 1) != 0) {
    local_288.mutex = &this_00->mutex;
    BrandedDecl::operator=(&local_288.value,(BrandedDecl *)local_358);
    bVar9 = (byte)local_360;
  }
  if (((bVar9 & 1) != 0) && (local_2e8 != (BrandScope *)0x0)) {
    local_2e8 = (BrandScope *)0x0;
    (*(code *)**(undefined8 **)local_348._88_8_)();
  }
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,SHARED,(Waiter *)0x0);
  }
  pBVar8 = local_288.value.brand.ptr;
  pMVar7 = local_288.mutex;
  if ((bVar1 & 1) == 0) {
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_0014d4f5;
  }
  local_360 = this->compiler;
  local_1d8.value.body.tag = local_288.value.body.tag;
  if (local_288.value.body.tag == 1) {
    local_1d8.value.body.field_1._32_8_ = local_288.value.body.field_1._32_8_;
    local_1d8.value.body.field_1._16_8_ = local_288.value.body.field_1._16_8_;
    local_1d8.value.body.field_1._24_8_ = local_288.value.body.field_1._24_8_;
    local_1d8.value.body.field_1._0_8_ = local_288.value.body.field_1._0_8_;
    local_1d8.value.body.field_1._8_8_ = local_288.value.body.field_1._8_8_;
    local_1d8.value.body.field_1.space[0x28] = local_288.value.body.field_1.space[0x28];
    if (local_288.value.body.field_1.space[0x28] == '\x01') {
      local_1d8.value.body.field_1._80_8_ = local_288.value.body.field_1._80_8_;
      local_1d8.value.body.field_1._88_8_ = local_288.value.body.field_1._88_8_;
      local_1d8.value.body.field_1._64_8_ = local_288.value.body.field_1._64_8_;
      local_1d8.value.body.field_1._72_8_ = local_288.value.body.field_1._72_8_;
      local_1d8.value.body.field_1._48_8_ = local_288.value.body.field_1._48_8_;
      local_1d8.value.body.field_1._56_8_ = local_288.value.body.field_1._56_8_;
      local_288.value.body.field_1.space[0x28] = '\0';
    }
LAB_0014d2e4:
    bVar4 = false;
  }
  else {
    if (local_288.value.body.tag != 2) goto LAB_0014d2e4;
    local_1d8.value.body.field_1._0_8_ = local_288.value.body.field_1._0_8_;
    local_1d8.value.body.field_1._8_8_ = local_288.value.body.field_1._8_8_;
    bVar4 = true;
  }
  local_1d8.value.brand.disposer = local_288.value.brand.disposer;
  local_288.value.brand.ptr = (BrandScope *)0x0;
  local_1d8.value.source._reader.segment = local_288.value.source._reader.segment;
  local_1d8.value.source._reader.capTable = local_288.value.source._reader.capTable;
  local_1d8.value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_288.value.source._reader.pointers._6_2_,
                local_288.value.source._reader.pointers._0_6_);
  local_1d8.value.source._reader.data = local_288.value.source._reader.data;
  local_1d8.value.source._reader._38_2_ = local_288.value.source._reader._38_2_;
  local_1d8.value.source._reader.dataSize = local_288.value.source._reader.dataSize;
  local_1d8.value.source._reader.pointerCount = local_288.value.source._reader.pointerCount;
  local_1d8.value.source._reader._44_4_ = local_288.value.source._reader._44_4_;
  local_1d8.value.source._reader.nestingLimit = local_288.value.source._reader.nestingLimit;
  local_288.mutex = (Mutex *)0x0;
  local_358._8_4_ = local_288.value.body.tag;
  if (local_288.value.body.tag == 1) {
    local_348._32_8_ = local_1d8.value.body.field_1._32_8_;
    local_348._16_8_ = local_1d8.value.body.field_1._16_8_;
    local_348._24_8_ = local_1d8.value.body.field_1._24_8_;
    local_348._0_8_ = local_1d8.value.body.field_1._0_8_;
    local_348._8_8_ = local_1d8.value.body.field_1._8_8_;
    local_348.space[0x28] = local_1d8.value.body.field_1.space[0x28];
    if (local_1d8.value.body.field_1.space[0x28] == '\x01') {
      local_348._80_8_ = local_1d8.value.body.field_1._80_8_;
      local_348._88_8_ = local_1d8.value.body.field_1._88_8_;
      local_348._64_8_ = local_1d8.value.body.field_1._64_8_;
      local_348._72_8_ = local_1d8.value.body.field_1._72_8_;
      local_348._48_8_ = local_1d8.value.body.field_1._48_8_;
      local_348._56_8_ = local_1d8.value.body.field_1._56_8_;
      local_1d8.value.body.field_1.space[0x28] = '\0';
    }
  }
  if (bVar4) {
    local_348._0_8_ = local_1d8.value.body.field_1._0_8_;
    local_348._8_8_ = local_1d8.value.body.field_1._8_8_;
  }
  local_2e8 = (BrandScope *)local_288.value.brand.disposer;
  local_1d8.value.brand.ptr = (BrandScope *)0x0;
  pWStack_2c0 = (WirePointer *)
                CONCAT26(local_288.value.source._reader.pointers._6_2_,
                         local_288.value.source._reader.pointers._0_6_);
  local_2b8._6_2_ = local_288.value.source._reader._38_2_;
  local_2b8._0_4_ = local_288.value.source._reader.dataSize;
  local_2b8._4_2_ = local_288.value.source._reader.pointerCount;
  uStack_2b0._4_4_ = local_288.value.source._reader._44_4_;
  uStack_2b0._0_4_ = local_288.value.source._reader.nestingLimit;
  local_2d8 = local_288.value.source._reader.segment;
  pWStack_2d0 = (WirePointer *)local_288.value.source._reader.capTable;
  local_2c8 = (WirePointer *)local_288.value.source._reader.data;
  local_1d8.mutex = (Mutex *)0x0;
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.compiler = local_360;
  (__return_storage_ptr__->ptr).field_1.value.decl.mutex = pMVar7;
  *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_288.value.body.tag;
  if (local_288.value.body.tag == 1) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x20) =
         local_348._32_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x10) =
         local_348._16_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x18) =
         local_348._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
         local_348._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8)
         = local_348._8_8_;
    *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_348.space[0x28];
    if (local_348.space[0x28] == '\x01') {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x50) =
           local_348._80_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x58) =
           local_348._88_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x40) =
           local_348._64_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x48) =
           local_348._72_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x30) =
           local_348._48_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x38) =
           local_348._56_8_;
      local_348._40_8_ = local_348._40_8_ & 0xffffffffffffff00;
    }
  }
  if (bVar4) {
    *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
         local_348._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8)
         = local_348._8_8_;
  }
  (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.disposer =
       local_288.value.brand.disposer;
  (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.ptr = pBVar8;
  pBStack_2e0 = (BrandScope *)0x0;
  pEVar5 = &(__return_storage_ptr__->ptr).field_1.value.decl;
  (pEVar5->value).source._reader.dataSize = local_288.value.source._reader.dataSize;
  (pEVar5->value).source._reader.pointerCount = local_288.value.source._reader.pointerCount;
  *(undefined2 *)&(pEVar5->value).source._reader.field_0x26 = local_288.value.source._reader._38_2_;
  *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.nestingLimit =
       CONCAT44(local_288.value.source._reader._44_4_,local_288.value.source._reader.nestingLimit);
  (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.data =
       local_288.value.source._reader.data;
  (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_288.value.source._reader.pointers._6_2_,
                local_288.value.source._reader.pointers._0_6_);
  (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.segment =
       local_288.value.source._reader.segment;
  (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.capTable =
       local_288.value.source._reader.capTable;
  local_358._0_8_ = 0;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_358);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_1d8);
LAB_0014d4f5:
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_288);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::applyBrand(
    kj::Array<CompiledType> arguments) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    auto args = KJ_MAP(arg, arguments) { return kj::mv(arg.decl.get(lock)); };
    KJ_IF_SOME(member, decl.get(lock).applyParams(kj::mv(args), {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}